

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O3

void __thiscall
reader_authority_suite::test_userinfo_host_port::test_method(test_userinfo_host_port *this)

{
  bool bVar1;
  uint local_230;
  undefined1 local_22c [12];
  view_type *local_220;
  undefined **local_218;
  undefined1 local_210;
  undefined8 *local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  undefined8 local_1f0;
  shared_count sStack_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined **local_1c0;
  undefined1 local_1b8;
  undefined8 *local_1b0;
  view_type **local_1a8;
  char *local_1a0;
  char *local_198;
  base<char,_trial::url::reader::basic_authority> local_190;
  char input [16];
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input,"user@1.2.3.4:80",0x10);
  local_190.input.len_ = strlen(input);
  local_190.current_token = end;
  local_190.input.ptr_ = input;
  local_190.current_view.ptr_ = input;
  local_190.current_view.len_ = local_190.input.len_;
  trial::url::reader::basic_authority<char>::do_next((basic_authority<char> *)&local_190);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x37);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_22c._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_190);
  local_220 = (view_type *)local_22c;
  local_22c._4_8_ = &local_230;
  local_230 = 3;
  local_1f8[0] = local_22c._0_4_ == authority_userinfo;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_1a8 = &local_220;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186558;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186558;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x37,2,2,2,"reader.code()",&local_1c0,
             "url::token::code::authority_userinfo",&local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x38);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  if (local_190.current_view.len_ == 4) {
    local_1f8[0] = *(int *)local_190.current_view.ptr_ == 0x72657375;
  }
  else {
    local_1f8[0] = false;
  }
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = &local_190.current_view;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186598;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = "user";
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186698;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x38,2,2,2,"reader.literal()",&local_1c0,"\"user\"",
             &local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x39);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_1f8[0] = trial::url::reader::basic_authority<char>::do_next
                           ((basic_authority<char> *)&local_190);
  local_22c[0] = local_1f8[0];
  local_230 = CONCAT31(local_230._1_3_,1);
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = (view_type *)local_22c;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_001865d8;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = &local_230;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_001865d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x39,2,2,2,"reader.next()",&local_1c0,"true",&local_1e0
            );
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3a);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_22c._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_190);
  local_230 = 4;
  local_1f8[0] = local_22c._0_4_ == authority_host;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = (view_type *)local_22c;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186558;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = &local_230;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186558;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3a,2,2,2,"reader.code()",&local_1c0,
             "url::token::code::authority_host",&local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x3b);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  if (local_190.current_view.len_ == 7) {
    local_1f8[0] = *(int *)((long)local_190.current_view.ptr_ + 3) == 0x342e332e &&
                   *(int *)local_190.current_view.ptr_ == 0x2e322e31;
  }
  else {
    local_1f8[0] = false;
  }
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = &local_190.current_view;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186598;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = "1.2.3.4";
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186398;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3b,2,2,2,"reader.literal()",&local_1c0,"\"1.2.3.4\"",
             &local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x3c);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_1f8[0] = trial::url::reader::basic_authority<char>::do_next
                           ((basic_authority<char> *)&local_190);
  local_22c[0] = local_1f8[0];
  local_230 = CONCAT31(local_230._1_3_,1);
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = (view_type *)local_22c;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_001865d8;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = &local_230;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_001865d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3c,2,2,2,"reader.next()",&local_1c0,"true",&local_1e0
            );
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x3d);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_22c._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_190);
  local_230 = 5;
  local_1f8[0] = local_22c._0_4_ == authority_port;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = (view_type *)local_22c;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186558;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = &local_230;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186558;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3d,2,2,2,"reader.code()",&local_1c0,
             "url::token::code::authority_port",&local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x3e);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  if (local_190.current_view.len_ == 2) {
    local_1f8[0] = *(short *)local_190.current_view.ptr_ == 0x3038;
  }
  else {
    local_1f8[0] = false;
  }
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = &local_190.current_view;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186598;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = "80";
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186658;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3e,2,2,2,"reader.literal()",&local_1c0,"\"80\"",
             &local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_138 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x3f);
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00186288;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next((basic_authority<char> *)&local_190);
  local_22c[0] = bVar1;
  local_230 = local_230 & 0xffffff00;
  local_1f8[0] = !bVar1;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  local_220 = (view_type *)local_22c;
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_001865d8;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_220;
  local_22c._4_8_ = &local_230;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_001865d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = local_22c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_218,&local_1a0,0x3f,2,2,2,"reader.next()",&local_1c0,"false",
             &local_1e0);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_userinfo_host_port)
{
    const char input[] = "user@1.2.3.4:80";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_userinfo);
    BOOST_REQUIRE_EQUAL(reader.literal(), "user");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1.2.3.4");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_port);
    BOOST_REQUIRE_EQUAL(reader.literal(), "80");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}